

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::SmallVectorImpl<llbuild::buildsystem::BuildKey>::clear
          (SmallVectorImpl<llbuild::buildsystem::BuildKey> *this)

{
  BuildKey *S;
  void *pvVar1;
  size_t sVar2;
  SmallVectorImpl<llbuild::buildsystem::BuildKey> *this_local;
  
  S = (BuildKey *)
      (this->super_SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false>).
      super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>.super_SmallVectorBase.
      BeginX;
  pvVar1 = (this->super_SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false>).
           super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>.
           super_SmallVectorBase.BeginX;
  sVar2 = SmallVectorBase::size((SmallVectorBase *)this);
  SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false>::destroy_range
            (S,(BuildKey *)((long)pvVar1 + sVar2 * 0x20));
  (this->super_SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false>).
  super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>.super_SmallVectorBase.Size =
       0;
  return;
}

Assistant:

void clear() {
    this->destroy_range(this->begin(), this->end());
    this->Size = 0;
  }